

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86_fma::create_pipeline(DeformableConv2D_x86_fma *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  long *plVar5;
  Allocator *pAVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Mat *pMVar10;
  int iVar11;
  Layer *pLVar12;
  int *piVar13;
  uint _h;
  int _elempack;
  ulong uVar14;
  undefined4 *puVar15;
  _func_int ***ppp_Var16;
  _func_int ***ppp_Var17;
  long lVar18;
  int k;
  ulong uVar19;
  undefined4 *puVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  _func_int ***ppp_Var24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  _func_int ***ppp_Var29;
  ParamDict pd_5;
  ParamDict pd;
  ParamDict local_170;
  DeformableConv2D_x86_fma *local_160;
  Option *local_158;
  ulong local_150;
  Mat local_148;
  void *local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  size_t local_f0;
  int local_e8;
  Allocator *local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  size_t sStack_d0;
  int local_c8;
  size_t local_c0;
  ulong local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  switch((this->super_DeformableConv2D).activation_type) {
  case 1:
    pLVar12 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_148);
    break;
  case 2:
    pLVar12 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_148);
    break;
  case 3:
    pLVar12 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_148);
    break;
  case 4:
    pLVar12 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_148);
    break;
  case 5:
    pLVar12 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_148);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_148);
    break;
  case 6:
    pLVar12 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_148);
    ParamDict::set((ParamDict *)&local_148,0,*(this->super_DeformableConv2D).activation_params.data)
    ;
    ParamDict::set((ParamDict *)&local_148,1,
                   *(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_148);
    break;
  default:
    pLVar12 = (Layer *)0x0;
    goto LAB_0057506b;
  }
  ParamDict::~ParamDict((ParamDict *)&local_148);
  (*pLVar12->_vptr_Layer[4])(pLVar12,opt);
LAB_0057506b:
  this->activation = pLVar12;
  iVar1 = (this->super_DeformableConv2D).kernel_w;
  lVar26 = (long)iVar1;
  iVar2 = (this->super_DeformableConv2D).kernel_h;
  _h = iVar2 * iVar1;
  uVar3 = (this->super_DeformableConv2D).num_output;
  local_b8 = (ulong)uVar3;
  uVar14 = (long)(this->super_DeformableConv2D).weight_data_size / (long)(int)_h;
  uVar14 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
  uVar21 = (long)uVar14 / (long)(int)uVar3;
  iVar11 = (int)uVar21;
  iVar25 = 1;
  uVar28 = 1;
  uVar14 = (long)uVar14 % (long)(int)uVar3 & 0xffffffff;
  if (opt->use_packing_layout == true) {
    uVar28 = (uint)((uVar21 & 3) == 0) * 3 + 1;
    if ((uVar21 & 7) == 0) {
      uVar28 = 8;
    }
    iVar25 = (uint)((uVar3 & 3) == 0) * 3 + 1;
    uVar14 = local_b8;
    if ((uVar3 & 7) == 0) {
      iVar25 = 8;
    }
  }
  if (opt->use_sgemm_convolution == true) {
    pLVar12 = create_layer_cpu(0x4a);
    this->gemm = pLVar12;
    ParamDict::ParamDict(&local_170);
    ParamDict::set(&local_170,2,0);
    ParamDict::set(&local_170,3,0);
    ParamDict::set(&local_170,4,1);
    ParamDict::set(&local_170,5,0);
    ParamDict::set(&local_170,6,1);
    ParamDict::set(&local_170,7,(this->super_DeformableConv2D).num_output);
    ParamDict::set(&local_170,8,0);
    ParamDict::set(&local_170,9,iVar11 * _h);
    ParamDict::set(&local_170,10,-(uint)((this->super_DeformableConv2D).bias_term == 0) | 1);
    ParamDict::set(&local_170,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_170);
    local_98.cstep = 0;
    local_98.data = (Allocator *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)local_98.data;
    local_98.dims = (int)local_98.refcount;
    local_98.w = local_98.refcount._4_4_;
    local_98._48_8_ = local_98.elemsize;
    local_98.c = local_98.elempack;
    Mat::reshape(&local_148,&(this->super_DeformableConv2D).weight_data,_h,iVar11,
                 (this->super_DeformableConv2D).num_output,(Allocator *)0x0);
    local_158 = opt;
    Mat::create(&local_98,iVar11 * _h,(this->super_DeformableConv2D).num_output,4,(Allocator *)0x0);
    opt = local_158;
    lVar26 = (long)(this->super_DeformableConv2D).num_output;
    if (0 < lVar26) {
      local_150 = (long)local_98.w * local_98.elemsize;
      uVar14 = (ulong)uVar28;
      lVar22 = 0;
      do {
        if ((int)uVar28 <= iVar11) {
          ppp_Var16 = (_func_int ***)
                      ((long)(_func_int ***)local_148.data +
                      local_148.elemsize * local_148.cstep * lVar22);
          ppp_Var24 = (_func_int ***)((long)(_func_int ***)local_98.data + local_150 * lVar22);
          lVar27 = 0;
          do {
            if (0 < (int)_h) {
              uVar19 = 0;
              uVar21 = uVar14;
              ppp_Var29 = ppp_Var16;
              ppp_Var17 = ppp_Var16;
              do {
                do {
                  *(undefined4 *)ppp_Var24 = *(undefined4 *)ppp_Var29;
                  ppp_Var24 = (_func_int ***)((long)ppp_Var24 + 4);
                  uVar21 = uVar21 - 1;
                  ppp_Var29 = (_func_int ***)
                              ((long)ppp_Var29 + (long)local_148.w * local_148.elemsize);
                } while (uVar21 != 0);
                uVar19 = uVar19 + 1;
                ppp_Var29 = (_func_int ***)((long)ppp_Var17 + 4);
                uVar21 = uVar14;
                ppp_Var17 = ppp_Var29;
              } while (uVar19 != _h);
            }
            lVar27 = lVar27 + uVar14;
            ppp_Var16 = (_func_int ***)
                        ((long)ppp_Var16 + (long)local_148.w * local_148.elemsize * uVar14);
          } while (lVar27 < (long)((long)iVar11 - (ulong)(uVar28 - 1)));
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != lVar26);
    }
    piVar13 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
    local_160 = this;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_148.data != (Allocator *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->super_DeformableConv2D).bias_term == 0) {
      piVar13 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_148.data = local_98.data;
      local_148.refcount._0_4_ = (int)local_98.refcount;
      local_148.refcount._4_4_ = local_98.refcount._4_4_;
      local_148.elemsize = local_98.elemsize;
      local_148.elempack = local_98.elempack;
      local_148.allocator = local_98.allocator;
      local_148.dims = local_98.dims;
      local_148.w = local_98.w;
      local_148.h = local_98.h;
      local_148.d = local_98.d;
      local_148.c = local_98.c;
      local_148.cstep = local_98.cstep;
      pLVar12 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_148);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar13 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_148.data != (Allocator *)0x0) {
              free(local_148.data);
            }
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uStack_f4 = 0;
      local_148.elemsize = SUB128(ZEXT812(0),4);
      local_c0 = 0;
      local_100 = (void *)0x0;
      uStack_f8 = 0;
      local_e8 = 0;
      local_e0 = (Allocator *)0x0;
      uStack_d8 = 0;
      local_c8 = 0;
      piVar13 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_f0 = local_148.elemsize;
      uStack_d4 = uStack_f4;
      sStack_d0 = local_148.elemsize;
      if ((Mat *)&local_100 != &(this->super_DeformableConv2D).bias_data) {
        piVar13 = (this->super_DeformableConv2D).bias_data.refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        local_100 = (this->super_DeformableConv2D).bias_data.data;
        piVar13 = (this->super_DeformableConv2D).bias_data.refcount;
        uStack_f8 = SUB84(piVar13,0);
        uStack_f4 = (undefined4)((ulong)piVar13 >> 0x20);
        local_f0 = (this->super_DeformableConv2D).bias_data.elemsize;
        local_e8 = (this->super_DeformableConv2D).bias_data.elempack;
        local_e0 = (this->super_DeformableConv2D).bias_data.allocator;
        uVar8 = (this->super_DeformableConv2D).bias_data.dims;
        uVar9 = (this->super_DeformableConv2D).bias_data.w;
        sStack_d0._0_4_ = (this->super_DeformableConv2D).bias_data.h;
        sStack_d0._4_4_ = (this->super_DeformableConv2D).bias_data.d;
        local_c8 = (this->super_DeformableConv2D).bias_data.c;
        local_c0 = (this->super_DeformableConv2D).bias_data.cstep;
        uStack_d8 = uVar8;
        uStack_d4 = uVar9;
      }
      local_148.cstep = local_98.cstep;
      local_148.c = local_98.c;
      local_148.h = local_98.h;
      local_148.d = local_98.d;
      local_148.w = local_98.w;
      local_148.dims = local_98.dims;
      local_148.allocator = local_98.allocator;
      local_148.elempack = local_98.elempack;
      local_148.elemsize = local_98.elemsize;
      local_148.refcount._4_4_ = local_98.refcount._4_4_;
      local_148.refcount._0_4_ = (int)local_98.refcount;
      local_148.data = local_98.data;
      pLVar12 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_148);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar26 = 0x48;
      do {
        piVar13 = *(int **)((long)&local_148.refcount + lVar26);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            pvVar4 = *(void **)((long)&local_148.data + lVar26);
            plVar5 = *(long **)((long)&local_148.allocator + lVar26);
            if (plVar5 == (long *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (**(code **)(*plVar5 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_148.cstep + lVar26) = 0;
        *(undefined8 *)((long)&local_148.refcount + lVar26 + 4) = 0;
        *(undefined8 *)((long)&local_148.elemsize + lVar26 + 4) = 0;
        *(undefined8 *)((long)&local_148.data + lVar26) = 0;
        *(undefined8 *)((long)&local_148.refcount + lVar26) = 0;
        *(undefined8 *)((long)&local_148.dims + lVar26) = 0;
        *(undefined8 *)((long)&local_148.h + lVar26) = 0;
        *(undefined4 *)((long)&local_148.c + lVar26) = 0;
        lVar26 = lVar26 + -0x48;
        opt = local_158;
      } while (lVar26 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar13 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_98.data != (Allocator *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_170);
  }
  else if ((iVar25 == 1) && (uVar28 == 1)) {
    piVar13 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = (this->weight_data_tm).refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar4 = (this->weight_data_tm).data;
        pAVar6 = (this->weight_data_tm).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])(pAVar6,pvVar4,uVar14);
        }
      }
    }
    piVar13 = (this->super_DeformableConv2D).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_DeformableConv2D).weight_data.data;
    (this->weight_data_tm).refcount = piVar13;
    (this->weight_data_tm).elemsize = (this->super_DeformableConv2D).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_DeformableConv2D).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_DeformableConv2D).weight_data.allocator;
    iVar1 = (this->super_DeformableConv2D).weight_data.w;
    iVar2 = (this->super_DeformableConv2D).weight_data.h;
    iVar11 = (this->super_DeformableConv2D).weight_data.d;
    (this->weight_data_tm).dims = (this->super_DeformableConv2D).weight_data.dims;
    (this->weight_data_tm).w = iVar1;
    (this->weight_data_tm).h = iVar2;
    (this->weight_data_tm).d = iVar11;
    (this->weight_data_tm).c = (this->super_DeformableConv2D).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_DeformableConv2D).weight_data.cstep;
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = (undefined4 *)(this->super_DeformableConv2D).weight_data.data;
    _elempack = uVar28 * iVar25;
    local_160 = this;
    local_158 = opt;
    Mat::create(local_48,(int)(iVar11 * _h * uVar3) / _elempack,(ulong)(uint)(_elempack * 4),
                _elempack,(Allocator *)0x0);
    pMVar10 = local_48;
    if (0 < (int)uVar3) {
      pvVar4 = (local_160->weight_data_tm).data;
      lVar27 = iVar2 * lVar26;
      lVar22 = iVar11 * lVar27;
      local_40 = lVar22 * 4;
      local_38 = lVar26 * 4;
      local_150 = 0;
      do {
        if (0 < iVar2) {
          local_b0 = local_50;
          lVar23 = 0;
          do {
            if (0 < iVar1) {
              lVar18 = 0;
              puVar15 = local_b0;
              do {
                if (0 < iVar11) {
                  uVar14 = (ulong)(uint)((int)local_150 >> 0x1f) << 0x20 | local_150 & 0xffffffff;
                  uVar19 = 0;
                  puVar20 = puVar15;
                  do {
                    uVar7 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar4 +
                     (long)(int)((((int)((long)uVar7 / (long)(int)uVar28) +
                                  ((int)lVar18 +
                                  ((int)((long)uVar14 / (long)iVar25) * iVar2 + (int)lVar23) * iVar1
                                  ) * (iVar11 / (int)uVar28)) * uVar28 +
                                 (int)((long)uVar7 % (long)(int)uVar28)) * iVar25 +
                                (int)((long)uVar14 % (long)iVar25)) * 4) = *puVar20;
                    uVar19 = uVar19 + 1;
                    puVar20 = puVar20 + lVar27;
                  } while ((uVar21 & 0xffffffff) != uVar19);
                }
                lVar18 = lVar18 + 1;
                puVar15 = puVar15 + 1;
              } while (lVar18 != lVar26);
            }
            lVar23 = lVar23 + 1;
            local_b0 = local_b0 + lVar26;
          } while (lVar23 != iVar2);
        }
        local_150 = local_150 + 1;
        local_50 = local_50 + lVar22;
      } while (local_150 != local_b8);
    }
    Mat::reshape(&local_148,local_48,iVar11 / (int)uVar28,_h,
                 (int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 | local_b8 & 0xffffffff)
                      / (long)iVar25),(Allocator *)0x0);
    opt = local_158;
    this = local_160;
    piVar13 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
    if (&local_148 != pMVar10) {
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      piVar13 = (local_160->weight_data_tm).refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pvVar4 = (local_160->weight_data_tm).data;
          pAVar6 = (local_160->weight_data_tm).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      piVar13 = (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
      (this->weight_data_tm).data = local_148.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_148.refcount._4_4_,(int)local_148.refcount);
      (this->weight_data_tm).elemsize = local_148.elemsize;
      (this->weight_data_tm).elempack = local_148.elempack;
      (this->weight_data_tm).allocator = local_148.allocator;
      (this->weight_data_tm).dims = local_148.dims;
      (this->weight_data_tm).w = local_148.w;
      (this->weight_data_tm).h = local_148.h;
      (this->weight_data_tm).d = local_148.d;
      (this->weight_data_tm).c = local_148.c;
      (this->weight_data_tm).cstep = local_148.cstep;
    }
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_148.data != (Allocator *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar13 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar4 = (this->super_DeformableConv2D).weight_data.data;
        pAVar6 = (this->super_DeformableConv2D).weight_data.allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeformableConv2D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.elemsize + 4) = 0;
    (this->super_DeformableConv2D).weight_data.data = (void *)0x0;
    (this->super_DeformableConv2D).weight_data.refcount = (int *)0x0;
    (this->super_DeformableConv2D).weight_data.dims = 0;
    (this->super_DeformableConv2D).weight_data.w = 0;
    (this->super_DeformableConv2D).weight_data.h = 0;
    (this->super_DeformableConv2D).weight_data.d = 0;
    (this->super_DeformableConv2D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_fma::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}